

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void fmt::internal::report_unknown_type(char code,char *type)

{
  int iVar1;
  CStringRef message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  CStringRef in_stack_ffffffffffffff70;
  BasicCStringRef<char> local_80 [6];
  undefined1 local_4d;
  char **in_stack_ffffffffffffffb8;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  CStringRef in_stack_ffffffffffffffc8;
  
  iVar1 = isprint((uint)in_DIL);
  if (iVar1 != 0) {
    local_4d = 1;
    message.data_ = (char *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,"unknown format code \'{}\' for {}"
              );
    format<char,char_const*>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0.data_,in_stack_ffffffffffffffb8);
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)message.data_,in_stack_ffffffffffffff68);
    FormatError::FormatError((FormatError *)in_stack_ffffffffffffff68,message);
    local_4d = 0;
    __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
  }
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      __cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(local_80,"unknown format code \'\\x{:02x}\' for {}");
  format<unsigned_int,char_const*>
            (in_stack_ffffffffffffffc8,(uint *)in_stack_ffffffffffffffc0.data_,
             in_stack_ffffffffffffffb8);
  BasicCStringRef<char>::BasicCStringRef((BasicCStringRef<char> *)in_stack_ffffffffffffff70.data_,s)
  ;
  FormatError::FormatError((FormatError *)s,in_stack_ffffffffffffff70);
  __cxa_throw(s,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

FMT_FUNC void fmt::internal::report_unknown_type(char code, const char *type) {
  (void)type;
  if (std::isprint(static_cast<unsigned char>(code))) {
    FMT_THROW(fmt::FormatError(
        fmt::format("unknown format code '{}' for {}", code, type)));
  }
  FMT_THROW(fmt::FormatError(
      fmt::format("unknown format code '\\x{:02x}' for {}",
        static_cast<unsigned>(code), type)));
}